

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexBuffer.cpp
# Opt level: O2

void __thiscall sf::VertexBuffer::VertexBuffer(VertexBuffer *this,Usage usage)

{
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__Drawable_001c4a10;
  GlResource::GlResource((GlResource *)this);
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__VertexBuffer_001c5798;
  this->m_buffer = 0;
  this->m_size = 0;
  this->m_primitiveType = Points;
  this->m_usage = usage;
  return;
}

Assistant:

VertexBuffer::VertexBuffer(VertexBuffer::Usage usage) :
m_buffer       (0),
m_size         (0),
m_primitiveType(Points),
m_usage        (usage)
{
}